

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::detail::enum_base::value(enum_base *this,char *name_,object *value,char *doc)

{
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  accessor<pybind11::detail::accessor_policies::str_attr> *in_RDX;
  string *in_RSI;
  dict *in_RDI;
  string type_name;
  str name;
  dict entries;
  str *in_stack_fffffffffffffe38;
  accessor<pybind11::detail::accessor_policies::obj_attr> *in_stack_fffffffffffffe40;
  allocator *this_00;
  object *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  pair<pybind11::object,_const_char_*> *value_00;
  accessor<pybind11::detail::accessor_policies::generic_item> *in_stack_fffffffffffffe70;
  handle in_stack_fffffffffffffe78;
  str *in_stack_fffffffffffffeb8;
  allocator local_129;
  string local_128 [200];
  object_api<pybind11::handle> *local_60;
  pair<pybind11::object,_const_char_*> local_48 [3];
  string *local_10;
  
  value_00 = local_48;
  local_10 = in_RSI;
  object_api<pybind11::handle>::attr
            ((object_api<pybind11::handle> *)in_RDX,
             (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  dict::dict<pybind11::detail::accessor_policies::str_attr>(in_RDI,in_RDX);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x3ac2a3);
  str::str((str *)in_RDI,(char *)in_RDX);
  uVar1 = dict::contains<pybind11::str&>
                    ((dict *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (!(bool)uVar1) {
    std::make_pair<pybind11::object&,char_const*&>
              (in_stack_fffffffffffffe48,(char **)in_stack_fffffffffffffe40);
    object_api<pybind11::handle>::operator[]
              ((object_api<pybind11::handle> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=
              (in_stack_fffffffffffffe70,value_00);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
              ((accessor<pybind11::detail::accessor_policies::generic_item> *)
               in_stack_fffffffffffffe40);
    std::pair<pybind11::object,_const_char_*>::~pair
              ((pair<pybind11::object,_const_char_*> *)0x3ac60c);
    object_api<pybind11::handle>::attr(local_60,in_stack_fffffffffffffe78);
    accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)
               CONCAT17(uVar1,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48);
    accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(in_stack_fffffffffffffe40);
    str::~str((str *)0x3ac657);
    dict::~dict((dict *)0x3ac664);
    return;
  }
  object_api<pybind11::handle>::attr
            ((object_api<pybind11::handle> *)in_RDX,
             (char *)CONCAT17(uVar1,in_stack_fffffffffffffe50));
  str::str<pybind11::detail::accessor_policies::str_attr>((str *)in_RDI,in_RDX);
  str::operator_cast_to_string(in_stack_fffffffffffffeb8);
  str::~str((str *)0x3ac338);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x3ac345);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_00,
                 (char *)in_RDI);
  this_00 = &local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,(char *)local_10,this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe78.m_ptr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe70);
  std::operator+(__lhs,(char *)this_00);
  value_error::runtime_error((value_error *)this_00,local_10);
  __cxa_throw(__lhs,&value_error::typeinfo,value_error::~value_error);
}

Assistant:

PYBIND11_NOINLINE void value(char const* name_, object value, const char *doc = nullptr) {
        dict entries = m_base.attr("__entries");
        str name(name_);
        if (entries.contains(name)) {
            std::string type_name = (std::string) str(m_base.attr("__name__"));
            throw value_error(type_name + ": element \"" + std::string(name_) + "\" already exists!");
        }

        entries[name] = std::make_pair(value, doc);
        m_base.attr(name) = value;
    }